

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpClient::Response> __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::attachCounter
          (ConcurrencyLimitingHttpClient *this,Promise<kj::HttpClient::Response> *promise,
          ConnectionCounter *counter)

{
  ConcurrencyLimitingHttpClient *pCVar1;
  TransformPromiseNodeBase *this_00;
  Disposer *extraout_RAX;
  PromiseNode *extraout_RDX;
  Promise<kj::HttpClient::Response> PVar2;
  ConnectionCounter local_28;
  
  pCVar1 = counter->parent;
  counter->parent = (ConcurrencyLimitingHttpClient *)0x0;
  local_28.parent = pCVar1;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)promise,
             _::
             TransformPromiseNode<kj::HttpClient::Response,_kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4096:25),_kj::_::PropagateException>
             ::anon_class_8_1_bc7188dc_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00445678;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pCVar1;
  local_28.parent = (ConcurrencyLimitingHttpClient *)0x0;
  (this->super_HttpClient)._vptr_HttpClient =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::HttpClient::Response,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::Response>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::{lambda(kj::HttpClient::Response&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (HttpClient *)this_00;
  ConnectionCounter::~ConnectionCounter(&local_28);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = extraout_RAX;
  return (Promise<kj::HttpClient::Response>)PVar2.super_PromiseBase.node;
}

Assistant:

static kj::Promise<Response> attachCounter(kj::Promise<Response>&& promise,
                                             ConnectionCounter&& counter) {
    return promise.then([counter = kj::mv(counter)](Response&& response) mutable {
      return Response {
        response.statusCode,
        response.statusText,
        response.headers,
        response.body.attach(kj::mv(counter))
      };
    });
  }